

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O2

void __thiscall cmCTestBuildHandler::PopulateCustomVectors(cmCTestBuildHandler *this,cmMakefile *mf)

{
  cmCTest *pcVar1;
  cmValue cVar2;
  string_view arg;
  string_view arg_00;
  int n;
  allocator<char> local_3d;
  int local_3c;
  string local_38;
  
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CTEST_CUSTOM_ERROR_MATCH",(allocator<char> *)&local_3c);
  cmCTest::PopulateCustomVector(pcVar1,mf,&local_38,&this->CustomErrorMatches);
  std::__cxx11::string::~string((string *)&local_38);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CTEST_CUSTOM_ERROR_EXCEPTION",(allocator<char> *)&local_3c);
  cmCTest::PopulateCustomVector(pcVar1,mf,&local_38,&this->CustomErrorExceptions);
  std::__cxx11::string::~string((string *)&local_38);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CTEST_CUSTOM_WARNING_MATCH",(allocator<char> *)&local_3c);
  cmCTest::PopulateCustomVector(pcVar1,mf,&local_38,&this->CustomWarningMatches);
  std::__cxx11::string::~string((string *)&local_38);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CTEST_CUSTOM_WARNING_EXCEPTION",(allocator<char> *)&local_3c);
  cmCTest::PopulateCustomVector(pcVar1,mf,&local_38,&this->CustomWarningExceptions);
  std::__cxx11::string::~string((string *)&local_38);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CTEST_CUSTOM_MAXIMUM_NUMBER_OF_ERRORS",
             (allocator<char> *)&local_3c);
  cmCTest::PopulateCustomInteger(pcVar1,mf,&local_38,&this->MaxErrors);
  std::__cxx11::string::~string((string *)&local_38);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CTEST_CUSTOM_MAXIMUM_NUMBER_OF_WARNINGS",
             (allocator<char> *)&local_3c);
  cmCTest::PopulateCustomInteger(pcVar1,mf,&local_38,&this->MaxWarnings);
  std::__cxx11::string::~string((string *)&local_38);
  local_3c = -1;
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CTEST_CUSTOM_ERROR_PRE_CONTEXT",&local_3d);
  cmCTest::PopulateCustomInteger(pcVar1,mf,&local_38,&local_3c);
  std::__cxx11::string::~string((string *)&local_38);
  if ((long)local_3c != 0xffffffffffffffff) {
    this->MaxPreContext = (long)local_3c;
  }
  local_3c = -1;
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CTEST_CUSTOM_ERROR_POST_CONTEXT",&local_3d);
  cmCTest::PopulateCustomInteger(pcVar1,mf,&local_38,&local_3c);
  std::__cxx11::string::~string((string *)&local_38);
  if ((long)local_3c != 0xffffffffffffffff) {
    this->MaxPostContext = (long)local_3c;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CTEST_CUSTOM_WARNING_MATCH",&local_3d);
  cVar2 = cmMakefile::GetDefinition(mf,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (cVar2.Value != (string *)0x0) {
    arg._M_str = ((cVar2.Value)->_M_dataplus)._M_p;
    arg._M_len = (cVar2.Value)->_M_string_length;
    cmExpandList(arg,&this->ReallyCustomWarningMatches,false);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CTEST_CUSTOM_WARNING_EXCEPTION",&local_3d);
  cVar2 = cmMakefile::GetDefinition(mf,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (cVar2.Value != (string *)0x0) {
    arg_00._M_str = ((cVar2.Value)->_M_dataplus)._M_p;
    arg_00._M_len = (cVar2.Value)->_M_string_length;
    cmExpandList(arg_00,&this->ReallyCustomWarningExceptions,false);
  }
  return;
}

Assistant:

void cmCTestBuildHandler::PopulateCustomVectors(cmMakefile* mf)
{
  this->CTest->PopulateCustomVector(mf, "CTEST_CUSTOM_ERROR_MATCH",
                                    this->CustomErrorMatches);
  this->CTest->PopulateCustomVector(mf, "CTEST_CUSTOM_ERROR_EXCEPTION",
                                    this->CustomErrorExceptions);
  this->CTest->PopulateCustomVector(mf, "CTEST_CUSTOM_WARNING_MATCH",
                                    this->CustomWarningMatches);
  this->CTest->PopulateCustomVector(mf, "CTEST_CUSTOM_WARNING_EXCEPTION",
                                    this->CustomWarningExceptions);
  this->CTest->PopulateCustomInteger(
    mf, "CTEST_CUSTOM_MAXIMUM_NUMBER_OF_ERRORS", this->MaxErrors);
  this->CTest->PopulateCustomInteger(
    mf, "CTEST_CUSTOM_MAXIMUM_NUMBER_OF_WARNINGS", this->MaxWarnings);

  int n = -1;
  this->CTest->PopulateCustomInteger(mf, "CTEST_CUSTOM_ERROR_PRE_CONTEXT", n);
  if (n != -1) {
    this->MaxPreContext = static_cast<size_t>(n);
  }

  n = -1;
  this->CTest->PopulateCustomInteger(mf, "CTEST_CUSTOM_ERROR_POST_CONTEXT", n);
  if (n != -1) {
    this->MaxPostContext = static_cast<size_t>(n);
  }

  // Record the user-specified custom warning rules.
  if (cmValue customWarningMatchers =
        mf->GetDefinition("CTEST_CUSTOM_WARNING_MATCH")) {
    cmExpandList(*customWarningMatchers, this->ReallyCustomWarningMatches);
  }
  if (cmValue customWarningExceptions =
        mf->GetDefinition("CTEST_CUSTOM_WARNING_EXCEPTION")) {
    cmExpandList(*customWarningExceptions,
                 this->ReallyCustomWarningExceptions);
  }
}